

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  pointer pcVar1;
  size_type sVar2;
  char **ppcVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  ostringstream e;
  string local_218;
  cmMakefile *local_1f8;
  cmTarget *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_1f8 = this;
  local_1f0 = target;
  sVar2 = cmGeneratorExpression::Find(feature);
  if (sVar2 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                  ,0x126c,
                  "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
                 );
  }
  pcVar1 = (feature->_M_dataplus)._M_p;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar1,pcVar1 + feature->_M_string_length);
  ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                      (C_FEATURES + 1,(char **)&DAT_005c57d8,(cmStrCmp *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (ppcVar3 == (char **)&DAT_005c57d8) {
    pcVar1 = (feature->_M_dataplus)._M_p;
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,pcVar1,pcVar1 + feature->_M_string_length);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_FEATURES + 1,C_STANDARDS,(cmStrCmp *)local_1e8);
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    if (ppcVar3 == C_STANDARDS) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar6 = "specified";
      if (error == (string *)0x0) {
        pcVar6 = "Specified";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," unknown feature \"",0x12);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(feature->_M_dataplus)._M_p,feature->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" for target \"",0xe);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_1f0->Name)._M_dataplus._M_p,
                          (local_1f0->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      if (error == (string *)0x0) {
        std::__cxx11::stringbuf::str();
        IssueMessage(local_1f8,FATAL_ERROR,&local_218,false);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_218);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return false;
    }
    pcVar6 = (char *)lang->_M_string_length;
    pcVar5 = "CXX";
  }
  else {
    pcVar6 = (char *)lang->_M_string_length;
    pcVar5 = "C";
  }
  std::__cxx11::string::_M_replace((ulong)lang,0,pcVar6,(ulong)pcVar5);
  return true;
}

Assistant:

bool cmMakefile::
CompileFeatureKnown(cmTarget const* target, const std::string& feature,
                    std::string& lang, std::string *error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature = std::find_if(cmArrayBegin(C_FEATURES) + 1,
              cmArrayEnd(C_FEATURES), cmStrCmp(feature))
              != cmArrayEnd(C_FEATURES);
  if (isCFeature)
    {
    lang = "C";
    return true;
    }
  bool isCxxFeature = std::find_if(cmArrayBegin(CXX_FEATURES) + 1,
              cmArrayEnd(CXX_FEATURES), cmStrCmp(feature))
              != cmArrayEnd(CXX_FEATURES);
  if (isCxxFeature)
    {
    lang = "CXX";
    return true;
    }
  std::ostringstream e;
  if (error)
    {
    e << "specified";
    }
  else
    {
    e << "Specified";
    }
  e << " unknown feature \"" << feature << "\" for "
    "target \"" << target->GetName() << "\".";
  if (error)
    {
    *error = e.str();
    }
  else
    {
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  return false;
}